

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

int read_palette(store_palette_entry *palette,int *npalette,png_const_structp pp,png_infop pi)

{
  uint uVar1;
  ulong uVar2;
  size_t __n;
  png_byte *ppVar3;
  int __c;
  char *pcVar4;
  store_palette_entry *__s;
  ulong uVar5;
  png_bytep trans_alpha;
  png_colorp pal;
  
  pal = (png_colorp)0x0;
  *npalette = -1;
  uVar2 = png_get_PLTE(pp,pi,&pal,npalette);
  uVar1 = *npalette;
  uVar5 = (ulong)uVar1;
  if ((uVar2 & 8) == 0) {
    if (uVar1 != 0xffffffff) {
      pcVar4 = "validate: invalid PLTE result";
      goto LAB_0010c1e3;
    }
    *npalette = 0;
    __c = 0x71;
    __n = 0x400;
    __s = palette;
  }
  else {
    if (uVar1 - 0x101 < 0xffffff00) {
      pcVar4 = "validate: invalid PLTE count";
      goto LAB_0010c1e3;
    }
    ppVar3 = &pal[uVar5 - 1].blue;
    for (uVar2 = uVar5; 0 < (long)uVar2; uVar2 = uVar2 - 1) {
      palette[uVar2 - 1].red = ((png_color *)(ppVar3 + -2))->red;
      palette[uVar2 - 1].green = ppVar3[-1];
      palette[uVar2 - 1].blue = *ppVar3;
      ppVar3 = ppVar3 + -3;
    }
    __s = palette + uVar5;
    __n = (0x100 - (long)(int)uVar1) * 4;
    __c = 0x7e;
  }
  memset(__s,__c,__n);
  uVar5 = 0;
  uVar2 = png_get_tRNS(pp);
  if ((uVar2 & 0x10) == 0) {
    uVar2 = (ulong)(uint)*npalette;
    if (*npalette < 1) {
      uVar2 = uVar5;
    }
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      palette[uVar5].alpha = 0xff;
    }
    for (; uVar2 < 0x100; uVar2 = uVar2 + 1) {
      palette[uVar2].alpha = '7';
    }
    return 0;
  }
  pcVar4 = "validate: unexpected png_get_tRNS (palette) result";
LAB_0010c1e3:
  png_error(pp,pcVar4);
}

Assistant:

static int
read_palette(store_palette palette, int *npalette, png_const_structp pp,
   png_infop pi)
{
   png_colorp pal;
   png_bytep trans_alpha;
   int num;

   pal = 0;
   *npalette = -1;

   if (png_get_PLTE(pp, pi, &pal, npalette) & PNG_INFO_PLTE)
   {
      int i = *npalette;

      if (i <= 0 || i > 256)
         png_error(pp, "validate: invalid PLTE count");

      while (--i >= 0)
      {
         palette[i].red = pal[i].red;
         palette[i].green = pal[i].green;
         palette[i].blue = pal[i].blue;
      }

      /* Mark the remainder of the entries with a flag value (other than
       * white/opaque which is the flag value stored above.)
       */
      memset(palette + *npalette, 126, (256-*npalette) * sizeof *palette);
   }

   else /* !png_get_PLTE */
   {
      if (*npalette != (-1))
         png_error(pp, "validate: invalid PLTE result");
      /* But there is no palette, so record this: */
      *npalette = 0;
      memset(palette, 113, sizeof (store_palette));
   }

   trans_alpha = 0;
   num = 2; /* force error below */
   if ((png_get_tRNS(pp, pi, &trans_alpha, &num, 0) & PNG_INFO_tRNS) != 0 &&
      (trans_alpha != NULL || num != 1/*returns 1 for a transparent color*/) &&
      /* Oops, if a palette tRNS gets expanded png_read_update_info (at least so
       * far as 1.5.4) does not remove the trans_alpha pointer, only num_trans,
       * so in the above call we get a success, we get a pointer (who knows what
       * to) and we get num_trans == 0:
       */
      !(trans_alpha != NULL && num == 0)) /* TODO: fix this in libpng. */
   {
      int i;

      /* Any of these are crash-worthy - given the implementation of
       * png_get_tRNS up to 1.5 an app won't crash if it just checks the
       * result above and fails to check that the variables it passed have
       * actually been filled in!  Note that if the app were to pass the
       * last, png_color_16p, variable too it couldn't rely on this.
       */
      if (trans_alpha == NULL || num <= 0 || num > 256 || num > *npalette)
         png_error(pp, "validate: unexpected png_get_tRNS (palette) result");

      for (i=0; i<num; ++i)
         palette[i].alpha = trans_alpha[i];

      for (num=*npalette; i<num; ++i)
         palette[i].alpha = 255;

      for (; i<256; ++i)
         palette[i].alpha = 33; /* flag value */

      return 1; /* transparency */
   }

   else
   {
      /* No palette transparency - just set the alpha channel to opaque. */
      int i;

      for (i=0, num=*npalette; i<num; ++i)
         palette[i].alpha = 255;

      for (; i<256; ++i)
         palette[i].alpha = 55; /* flag value */

      return 0; /* no transparency */
   }
}